

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t * container_range_of_ones(uint32_t range_start,uint32_t range_end,uint8_t *result_type)

{
  uint64_t cardinality;
  uint8_t *result_type_local;
  uint32_t range_end_local;
  uint32_t range_start_local;
  
  if (range_start <= range_end) {
    if ((range_end - range_start) + 1 < 3) {
      *result_type = '\x02';
      _range_end_local = array_container_create_range(range_start,range_end);
    }
    else {
      *result_type = '\x03';
      _range_end_local = (array_container_t *)run_container_create_range(range_start,range_end);
    }
    return _range_end_local;
  }
  __assert_fail("range_end >= range_start",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x1131,"container_t *container_range_of_ones(uint32_t, uint32_t, uint8_t *)");
}

Assistant:

static inline container_t *container_range_of_ones(
    uint32_t range_start, uint32_t range_end,
    uint8_t *result_type
){
    assert(range_end >= range_start);
    uint64_t cardinality =  range_end - range_start + 1;
    if(cardinality <= 2) {
      *result_type = ARRAY_CONTAINER_TYPE;
      return array_container_create_range(range_start, range_end);
    } else {
      *result_type = RUN_CONTAINER_TYPE;
      return run_container_create_range(range_start, range_end);
    }
}